

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  int i;
  ImGuiWindow **ppIVar3;
  ImGuiWindow *in_RDI;
  int n;
  int new_order;
  int cur_order;
  ImGuiContext *g;
  int local_1c;
  
  pIVar2 = GImGui;
  local_1c = (int)in_RDI->FocusOrder;
  ppIVar3 = ImVector<ImGuiWindow_*>::back(&GImGui->WindowsFocusOrder);
  if (*ppIVar3 != in_RDI) {
    i = (pIVar2->WindowsFocusOrder).Size + -1;
    for (; local_1c < i; local_1c = local_1c + 1) {
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->WindowsFocusOrder,local_1c + 1);
      pIVar1 = *ppIVar3;
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->WindowsFocusOrder,local_1c);
      *ppIVar3 = pIVar1;
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->WindowsFocusOrder,local_1c);
      (*ppIVar3)->FocusOrder = (*ppIVar3)->FocusOrder + -1;
    }
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->WindowsFocusOrder,i);
    *ppIVar3 = in_RDI;
    in_RDI->FocusOrder = (short)i;
  }
  return;
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == window->RootWindow);

    const int cur_order = window->FocusOrder;
    IM_ASSERT(g.WindowsFocusOrder[cur_order] == window);
    if (g.WindowsFocusOrder.back() == window)
        return;

    const int new_order = g.WindowsFocusOrder.Size - 1;
    for (int n = cur_order; n < new_order; n++)
    {
        g.WindowsFocusOrder[n] = g.WindowsFocusOrder[n + 1];
        g.WindowsFocusOrder[n]->FocusOrder--;
        IM_ASSERT(g.WindowsFocusOrder[n]->FocusOrder == n);
    }
    g.WindowsFocusOrder[new_order] = window;
    window->FocusOrder = (short)new_order;
}